

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

string * __thiscall
tinyusdz::tydra::(anonymous_namespace)::DumpXformNodeRec_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,XformNode *node,
          uint32_t indent)

{
  _anonymous_namespace_ *p_Var1;
  ostream *poVar2;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  XformNode *child;
  _anonymous_namespace_ *this_00;
  uint uVar4;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)node & 0xffffffff),n);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1d8);
  poVar2 = ::std::operator<<(poVar2,"Prim name: ");
  poVar2 = ::std::operator<<(poVar2,(string *)this);
  poVar2 = ::std::operator<<(poVar2," PrimID: ");
  poVar2 = ::std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = ::std::operator<<(poVar2," (Path ");
  poVar2 = ::std::operator<<(poVar2,(Path *)(this + 0x20));
  poVar2 = ::std::operator<<(poVar2,") Xformable? ");
  poVar2 = ::std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  poVar2 = ::std::operator<<(poVar2," resetXformStack? ");
  poVar2 = ::std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  ::std::operator<<(poVar2," {\n");
  ::std::__cxx11::string::_M_dispose();
  uVar4 = (int)node + 1;
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)uVar4,n_00);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1d8);
  poVar2 = ::std::operator<<(poVar2,"parent_world: ");
  poVar2 = ::std::operator<<(poVar2,(matrix4d *)(this + 0x228));
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)uVar4,n_01);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1d8);
  poVar2 = ::std::operator<<(poVar2,"world: ");
  poVar2 = ::std::operator<<(poVar2,(matrix4d *)(this + 0x1a8));
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)uVar4,n_02);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1d8);
  poVar2 = ::std::operator<<(poVar2,"local: ");
  poVar2 = ::std::operator<<(poVar2,(matrix4d *)(this + 0x128));
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::_M_dispose();
  p_Var1 = *(_anonymous_namespace_ **)(this + 0x110);
  uVar3 = extraout_RDX;
  for (this_00 = *(_anonymous_namespace_ **)(this + 0x108); this_00 != p_Var1;
      this_00 = this_00 + 0x2a8) {
    DumpXformNodeRec_abi_cxx11_(&local_1d8,this_00,(XformNode *)(ulong)uVar4,indent);
    ::std::operator<<(local_1a8,(string *)&local_1d8);
    ::std::__cxx11::string::_M_dispose();
    uVar3 = extraout_RDX_00;
  }
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)uVar4,(uint32_t)uVar3);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1d8);
  ::std::operator<<(poVar2,"}\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpXformNodeRec(const XformNode &node, uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << "Prim name: " << node.element_name
     << " PrimID: " << node.prim_id << " (Path " << node.absolute_path
     << ") Xformable? " << node.has_xform() << " resetXformStack? "
     << node.has_resetXformStack() << " {\n";
  ss << pprint::Indent(indent + 1)
     << "parent_world: " << node.get_parent_world_matrix() << "\n";
  ss << pprint::Indent(indent + 1) << "world: " << node.get_world_matrix()
     << "\n";
  ss << pprint::Indent(indent + 1) << "local: " << node.get_local_matrix()
     << "\n";

  for (const auto &child : node.children) {
    ss << DumpXformNodeRec(child, indent + 1);
  }
  ss << pprint::Indent(indent + 1) << "}\n";

  return ss.str();
}